

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# section.cpp
# Opt level: O2

bool sect_IsSizeKnown(Section *sect)

{
  SectionStackEntry *pSVar1;
  int iVar2;
  SectionStackEntry **ppSVar3;
  bool bVar4;
  
  if (sect->modifier == SECTION_NORMAL) {
    bVar4 = false;
    if ((currentSection != sect) && (bVar4 = false, currentLoadSection != sect)) {
      ppSVar3 = &sectionStack;
      while( true ) {
        pSVar1 = *ppSVar3;
        bVar4 = pSVar1 == (SectionStackEntry *)0x0;
        if (bVar4) break;
        if ((pSVar1->section != (Section *)0x0) &&
           (iVar2 = strcmp(sect->name,pSVar1->section->name), iVar2 == 0)) {
          return bVar4;
        }
        ppSVar3 = &pSVar1->next;
      }
    }
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool sect_IsSizeKnown(struct Section const NONNULL(sect))
{
	// SECTION UNION and SECTION FRAGMENT can still grow
	if (sect->modifier != SECTION_NORMAL)
		return false;

	// The current section (or current load section if within one) is still growing
	if (sect == currentSection || sect == currentLoadSection)
		return false;

	// Any section on the stack is still growing
	for (struct SectionStackEntry *stack = sectionStack; stack; stack = stack->next) {
		if (stack->section && !strcmp(sect->name, stack->section->name))
			return false;
	}

	return true;
}